

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall FailableMemoryAllocator::checkAllFailedAllocsWereDone(FailableMemoryAllocator *this)

{
  char *in_RDI;
  SimpleString failText;
  UtestShell *currentTest;
  UtestShell *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff10;
  UtestShell *message;
  UtestShell *lineNumber;
  UtestShell *in_stack_ffffffffffffff38;
  FailFailure *in_stack_ffffffffffffff40;
  undefined1 local_b8 [104];
  char local_50 [32];
  char local_30 [32];
  UtestShell *local_10;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    local_10 = UtestShell::getCurrent();
    SimpleString::SimpleString(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
    if (*(long *)(*(long *)(in_RDI + 0x28) + 8) == 0) {
      StringFromFormat(local_50,"Expected allocation number %d was never done",
                       (ulong)**(uint **)(in_RDI + 0x28));
      SimpleString::operator=(in_stack_ffffffffffffff10,(SimpleString *)in_stack_ffffffffffffff08);
      SimpleString::~SimpleString((SimpleString *)0x114723);
    }
    else {
      StringFromFormat(local_30,"Expected failing alloc at %s:%d was never done",
                       *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8),
                       (ulong)*(uint *)(*(long *)(in_RDI + 0x28) + 0x10));
      SimpleString::operator=(in_stack_ffffffffffffff10,(SimpleString *)in_stack_ffffffffffffff08);
      SimpleString::~SimpleString((SimpleString *)0x114698);
    }
    message = local_10;
    lineNumber = local_10;
    UtestShell::getName(in_stack_ffffffffffffff08);
    SimpleString::asCharString((SimpleString *)0x114776);
    UtestShell::getLineNumber(local_10);
    FailFailure::FailFailure
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_RDI,(size_t)lineNumber,
               (SimpleString *)message);
    (*lineNumber->_vptr_UtestShell[0x26])(lineNumber,local_b8);
    FailFailure::~FailFailure((FailFailure *)0x1147d6);
    SimpleString::~SimpleString((SimpleString *)0x1147e0);
    SimpleString::~SimpleString((SimpleString *)0x1147ed);
  }
  return;
}

Assistant:

void FailableMemoryAllocator::checkAllFailedAllocsWereDone()
{
    if (head_) {
        UtestShell* currentTest = UtestShell::getCurrent();
        SimpleString failText;
        if (head_->file_)
            failText = StringFromFormat("Expected failing alloc at %s:%d was never done", head_->file_, (int) head_->line_);
        else
            failText = StringFromFormat("Expected allocation number %d was never done", (int) head_->allocNumberToFail_);

        currentTest->failWith(FailFailure(currentTest, currentTest->getName().asCharString(), currentTest->getLineNumber(), failText));
    }
}